

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemPool.c
# Opt level: O2

deMemPool * deMemPool_createRoot(deMemPoolUtil *util,deUint32 flags)

{
  deMemPoolAllocFailFunc p_Var1;
  deMemPool *pool;
  deMemPoolUtil *pdVar2;
  deMemPool *pdVar3;
  
  pool = createPoolInternal((deMemPool *)0x0);
  pdVar3 = (deMemPool *)0x0;
  if ((pool != (deMemPool *)0x0) && (pdVar3 = pool, util != (deMemPoolUtil *)0x0)) {
    pdVar2 = (deMemPoolUtil *)deMemPool_alloc(pool,0x10);
    if (pdVar2 == (deMemPoolUtil *)0x0) {
      deMemPool_destroy(pool);
      pdVar3 = (deMemPool *)0x0;
    }
    else {
      p_Var1 = util->allocFailCallback;
      pdVar2->userPointer = util->userPointer;
      pdVar2->allocFailCallback = p_Var1;
      pool->util = pdVar2;
    }
  }
  return pdVar3;
}

Assistant:

deMemPool* deMemPool_createRoot	(const deMemPoolUtil* util, deUint32 flags)
{
	deMemPool* pool = createPoolInternal(DE_NULL);
	if (!pool)
		return DE_NULL;
#if defined(DE_SUPPORT_FAILING_POOL_ALLOC)
	if (flags & DE_MEMPOOL_ENABLE_FAILING_ALLOCS)
		pool->allowFailing = DE_TRUE;
#endif
#if defined(DE_SUPPORT_DEBUG_POOLS)
	if (flags & DE_MEMPOOL_ENABLE_DEBUG_ALLOCS)
	{
		pool->enableDebugAllocs		= DE_TRUE;
		pool->debugAllocListHead	= DE_NULL;
	}
#endif
	DE_UNREF(flags); /* in case no debug features enabled */

	/* Get copy of utilities. */
	if (util)
	{
		deMemPoolUtil* utilCopy = DE_POOL_NEW(pool, deMemPoolUtil);
		DE_ASSERT(util->allocFailCallback);
		if (!utilCopy)
		{
			deMemPool_destroy(pool);
			return DE_NULL;
		}

		memcpy(utilCopy, util, sizeof(deMemPoolUtil));
		pool->util = utilCopy;
	}

	return pool;
}